

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O3

void __thiscall
GslSpan_FromPointerPointerConstructor_Test::TestBody
          (GslSpan_FromPointerPointerConstructor_Test *this)

{
  int *lhs;
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  int arr [4];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  undefined8 local_28;
  char *pcStack_20;
  
  local_28 = &DAT_200000001;
  pcStack_20 = (char *)0x400000003;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_40.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            (local_38,"s.length ()","2",(long *)&local_48,(int *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xdc,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)local_48._M_head_impl;
  testing::internal::CmpHelperEQ<int*,int*>
            (local_38,"s.data ()","&arr[0]",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xdd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>(local_38,"s[0]","1",(int *)&local_28,(int *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xde,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  lhs = (int *)((long)&local_28 + 4);
  local_48._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>(local_38,"s[1]","2",lhs,(int *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xdf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_40.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            (local_38,"s.length ()","2",(long *)&local_48,(int *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xe3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)&local_28;
  testing::internal::CmpHelperEQ<int*,int*>
            (local_38,"s.data ()","&arr[0]",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xe4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>(local_38,"s[0]","1",(int *)&local_28,(int *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xe5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>(local_38,"s[1]","2",lhs,(int *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xe6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = local_40.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            (local_38,"s.length ()","0",(long *)&local_48,(int *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xea,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)&local_28;
  testing::internal::CmpHelperEQ<int*,int*>
            (local_38,"s.data ()","&arr[0]",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xeb,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = local_40.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            (local_38,"s.length ()","0",(long *)&local_48,(int *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xef,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)&local_28;
  testing::internal::CmpHelperEQ<int*,int*>
            (local_38,"s.data ()","&arr[0]",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xf0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = local_40.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            (local_38,"s.length ()","0",(long *)&local_48,(int *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xf6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<int*,decltype(nullptr)>
            (local_38,"s.data ()","nullptr",(int **)&local_48,&local_40.data_);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xf7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = local_40.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            (local_38,"s.length ()","0",(long *)&local_48,(int *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xfc,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<int*,decltype(nullptr)>
            (local_38,"s.data ()","nullptr",(int **)&local_48,&local_40.data_);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xfd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_40.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            (local_38,"s.length ()","2",(long *)&local_48,(int *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x102,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
  }
  else {
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
    local_40.data_ = (AssertHelperData *)&local_28;
    testing::internal::CmpHelperEQ<int*,int*>
              (local_38,"s.data ()","&arr[0]",(int **)&local_48,(int **)&local_40);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = anon_var_dwarf_d372b + 0x50;
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x103,pcVar1);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_48._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>(local_38,"s[0]","1",(int *)&local_28,(int *)&local_48);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = anon_var_dwarf_d372b + 0x50;
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x104,pcVar1);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_48._M_head_impl._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>(local_38,"s[1]","2",lhs,(int *)&local_48);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = anon_var_dwarf_d372b + 0x50;
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x105,pcVar1);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_40.data_ = local_40.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<long,int>
              (local_38,"s.length ()","0",(long *)&local_48,(int *)&local_40);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = anon_var_dwarf_d372b + 0x50;
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x109,pcVar1);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
    local_40.data_ = (AssertHelperData *)&local_28;
    testing::internal::CmpHelperEQ<int*,int*>
              (local_38,"s.data ()","&arr[0]",(int **)&local_48,(int **)&local_40);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = anon_var_dwarf_d372b + 0x50;
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x10a,pcVar1);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_40.data_ = local_40.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<long,int>
              (local_38,"s.length ()","0",(long *)&local_48,(int *)&local_40);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = anon_var_dwarf_d372b + 0x50;
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x110,pcVar1);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_40.data_ = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<int*,decltype(nullptr)>
              (local_38,"s.data ()","nullptr",(int **)&local_48,&local_40.data_);
    if (local_38[0] != (internal)0x0) goto LAB_0015a4bb;
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x111,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
LAB_0015a4bb:
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST (GslSpan, FromPointerPointerConstructor) {
    int arr[4] = {1, 2, 3, 4};

    {
        span<int> s{&arr[0], &arr[2]};
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        span<int, 2> s{&arr[0], &arr[2]};
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        span<int> s{&arr[0], &arr[0]};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }
    {
        span<int, 0> s{&arr[0], &arr[0]};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }

    {
        int * p = nullptr;
        span<int> s{p, p};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }
    {
        int * p = nullptr;
        span<int, 0> s{p, p};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }

    {
        auto s = make_span (&arr[0], &arr[2]);
        ASSERT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        auto s = make_span (&arr[0], &arr[0]);
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }

    {
        int * p = nullptr;
        auto s = make_span (p, p);
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }
}